

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yarn5s.hpp
# Opt level: O0

void __thiscall trng::yarn5s::jump2(yarn5s *this,uint s)

{
  uint in_ESI;
  int32_t *in_RDI;
  result_type d [5];
  result_type r [5];
  uint i;
  result_type c [25];
  result_type b [25];
  int32_t local_128;
  int32_t local_124;
  int32_t local_120;
  int32_t local_11c;
  int32_t local_118;
  int32_t local_108;
  int32_t local_104;
  int32_t local_100;
  int32_t local_fc;
  int32_t local_f8;
  uint local_ec;
  int32_t local_e8 [28];
  int32_t local_78;
  int32_t local_74;
  int32_t local_70;
  int32_t local_6c;
  int32_t local_68;
  int32_t local_64;
  int32_t local_60;
  int32_t local_5c;
  int32_t local_58;
  int32_t local_54;
  int32_t local_50;
  int32_t local_4c;
  int32_t local_48;
  int32_t local_44;
  int32_t local_40;
  int32_t local_3c;
  int32_t local_38;
  int32_t local_34;
  int32_t local_30;
  int32_t local_2c;
  int32_t local_28;
  int32_t local_24;
  int32_t local_20;
  int32_t local_1c;
  int32_t local_18;
  uint local_c;
  
  local_c = in_ESI;
  memset(local_e8,0,100);
  local_78 = *in_RDI;
  local_74 = in_RDI[1];
  local_70 = in_RDI[2];
  local_6c = in_RDI[3];
  local_68 = in_RDI[4];
  local_64 = 1;
  local_60 = 0;
  local_5c = 0;
  local_58 = 0;
  local_54 = 0;
  local_50 = 0;
  local_4c = 1;
  local_48 = 0;
  local_44 = 0;
  local_40 = 0;
  local_3c = 0;
  local_38 = 0;
  local_34 = 1;
  local_30 = 0;
  local_2c = 0;
  local_28 = 0;
  local_24 = 0;
  local_20 = 0;
  local_1c = 1;
  local_18 = 0;
  for (local_ec = 0; local_ec < local_c; local_ec = local_ec + 1) {
    int_math::matrix_mult<5>
              ((int32_t (*) [25])&local_78,(int32_t (*) [25])&local_78,(int32_t (*) [25])local_e8,
               0x7fffa78f);
    local_ec = local_ec + 1;
    if (local_c <= local_ec) break;
    int_math::matrix_mult<5>
              ((int32_t (*) [25])local_e8,(int32_t (*) [25])local_e8,(int32_t (*) [25])&local_78,
               0x7fffa78f);
  }
  local_108 = in_RDI[5];
  local_104 = in_RDI[6];
  local_100 = in_RDI[7];
  local_fc = in_RDI[8];
  local_f8 = in_RDI[9];
  if ((local_c & 1) == 0) {
    int_math::matrix_vec_mult<5>
              ((int32_t (*) [25])&local_78,(int32_t (*) [5])&local_108,(int32_t (*) [5])&local_128,
               0x7fffa78f);
  }
  else {
    int_math::matrix_vec_mult<5>
              ((int32_t (*) [25])local_e8,(int32_t (*) [5])&local_108,(int32_t (*) [5])&local_128,
               0x7fffa78f);
  }
  in_RDI[5] = local_128;
  in_RDI[6] = local_124;
  in_RDI[7] = local_120;
  in_RDI[8] = local_11c;
  in_RDI[9] = local_118;
  return;
}

Assistant:

TRNG_CUDA_ENABLE
  inline void yarn5s::jump2(unsigned int s) {
    result_type b[25], c[25]{};
    b[0] = P.a[0];
    b[1] = P.a[1];
    b[2] = P.a[2];
    b[3] = P.a[3];
    b[4] = P.a[4];
    b[5] = 1;
    b[6] = 0;
    b[7] = 0;
    b[8] = 0;
    b[9] = 0;
    b[10] = 0;
    b[11] = 1;
    b[12] = 0;
    b[13] = 0;
    b[14] = 0;
    b[15] = 0;
    b[16] = 0;
    b[17] = 1;
    b[18] = 0;
    b[19] = 0;
    b[20] = 0;
    b[21] = 0;
    b[22] = 0;
    b[23] = 1;
    b[24] = 0;
    for (unsigned int i{0}; i < s; ++i) {
      int_math::matrix_mult<5>(b, b, c, modulus);
      ++i;
      if (not(i < s))
        break;
      int_math::matrix_mult<5>(c, c, b, modulus);
    }
    const result_type r[5]{S.r[0], S.r[1], S.r[2], S.r[3], S.r[4]};
    result_type d[5];
    if ((s & 1u) == 0)
      int_math::matrix_vec_mult<5>(b, r, d, modulus);
    else
      int_math::matrix_vec_mult<5>(c, r, d, modulus);
    S.r[0] = d[0];
    S.r[1] = d[1];
    S.r[2] = d[2];
    S.r[3] = d[3];
    S.r[4] = d[4];
  }